

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O2

double CalcPriority(TProblem *p,
                   unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
                   *serveTime,TCacheReq *candidate)

{
  pointer pvVar1;
  unsigned_long uVar2;
  ulong uVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  iterator iVar6;
  long lVar7;
  pointer puVar8;
  double dVar9;
  key_type local_70;
  long local_60;
  TProblem *local_58;
  _Hashtable<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_50;
  _Hashtable<TEndpointCache,_std::pair<const_TEndpointCache,_unsigned_long>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointCache>,_std::hash<TEndpointCache>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_48;
  _Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  pointer local_38;
  
  pvVar1 = (p->VideoEndpoints).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = pvVar1[candidate->VideoId].
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = *(pointer *)
              ((long)&pvVar1[candidate->VideoId].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data + 8);
  local_48 = &(p->Latencies)._M_h;
  local_50 = &(p->RequestsCount)._M_h;
  local_60 = 0;
  local_58 = p;
  local_40 = (_Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)serveTime;
  for (; puVar8 != local_38; puVar8 = puVar8 + 1) {
    uVar2 = *puVar8;
    local_70.ServerId = candidate->VideoId;
    local_70.EndpointId = uVar2;
    pmVar4 = std::__detail::
             _Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_40,(key_type *)&local_70);
    uVar3 = *pmVar4;
    local_70.ServerId = candidate->ServerId;
    local_70.EndpointId = uVar2;
    iVar5 = std::
            _Hashtable<TEndpointCache,_std::pair<const_TEndpointCache,_unsigned_long>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointCache>,_std::hash<TEndpointCache>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(local_48,&local_70);
    local_70.ServerId = candidate->VideoId;
    local_70.EndpointId = uVar2;
    iVar6 = std::
            _Hashtable<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(local_50,(key_type *)&local_70);
    if ((iVar5.super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>.
         _M_cur != (__node_type *)0x0) &&
       (lVar7 = uVar3 - *(ulong *)((long)iVar5.
                                         super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>
                                         ._M_cur + 0x18),
       iVar6.super__Node_iterator_base<std::pair<const_TEndpointVideo,_unsigned_long>,_false>._M_cur
       != (__node_type *)0x0 &&
       (*(ulong *)((long)iVar5.
                         super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>
                         ._M_cur + 0x18) <= uVar3 && lVar7 != 0))) {
      local_60 = local_60 +
                 lVar7 * *(long *)((long)iVar6.
                                         super__Node_iterator_base<std::pair<const_TEndpointVideo,_unsigned_long>,_false>
                                         ._M_cur + 0x18);
    }
  }
  uVar2 = (local_58->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[candidate->VideoId];
  dVar9 = ((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
  uVar2 = (local_58->Capacities).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[candidate->ServerId];
  return (((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) +
         (((double)CONCAT44(0x45300000,(int)((ulong)local_60 >> 0x20)) - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_60) - 4503599627370496.0)) / dVar9) - dVar9;
}

Assistant:

double CalcPriority(
        TProblem& p,
        std::unordered_map<TEndpointVideo, size_t>& serveTime,
        TCacheReq& candidate
    ) {
    size_t savedTime = 0;
    for (size_t e : p.VideoEndpoints[candidate.VideoId]) {
        size_t currentServeTime = serveTime[{e, candidate.VideoId}];
        auto foundLatency = p.Latencies.find({e, candidate.ServerId});
        auto foundRequestCount = p.RequestsCount.find({e, candidate.VideoId});
        if (foundLatency != p.Latencies.end() &&
            foundLatency->second < currentServeTime &&
            foundRequestCount != p.RequestsCount.end()) {
            savedTime += foundRequestCount->second * (currentServeTime - foundLatency->second);
        }
    }
    return static_cast<double>(savedTime) / p.Vides[candidate.VideoId] +
        p.Capacities[candidate.ServerId] - p.Vides[candidate.VideoId];
}